

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

void __thiscall
Variable_connectionsPersistAfterImporting_Test::~Variable_connectionsPersistAfterImporting_Test
          (Variable_connectionsPersistAfterImporting_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Variable, connectionsPersistAfterImporting)
{
    auto model = libcellml::Model::create("model");
    auto importer = libcellml::Importer::create();

    auto importedComponent = libcellml::Component::create("importedComponent");
    model->addComponent(importedComponent);

    auto importSource = libcellml::ImportSource::create();
    importSource->setUrl("importedModelWithMaps.cellml");
    importedComponent->setImportSource(importSource);
    importedComponent->setImportReference("importMe");

    EXPECT_TRUE(model->hasUnresolvedImports());
    importer->resolveImports(model, resourcePath());
    EXPECT_FALSE(model->hasUnresolvedImports());

    model = importer->flattenModel(model);

    EXPECT_NE(nullptr, model->component("importedComponent"));
    EXPECT_NE(nullptr, model->component("importedComponent")->component("child1"));
    EXPECT_NE(nullptr, model->component("importedComponent")->component("child2"));
    EXPECT_NE(nullptr, model->component("importedComponent")->component("child1")->variable("x"));
    EXPECT_NE(nullptr, model->component("importedComponent")->component("child2")->variable("x"));

    auto x1 = model->component("importedComponent")->component("child1")->variable("x");
    auto x2 = model->component("importedComponent")->component("child2")->variable("x");
    EXPECT_EQ(size_t(1), x1->equivalentVariableCount());
    EXPECT_EQ(size_t(1), x2->equivalentVariableCount());
    EXPECT_EQ(x1, x2->equivalentVariable(0));
    EXPECT_EQ(x2, x1->equivalentVariable(0));
}